

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogCompare.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Base_ptr p_Var1;
  pointer pOVar2;
  pointer pbVar3;
  bool bVar4;
  ValueType *pVVar5;
  ValueType *pVVar6;
  ValueType *pVVar7;
  LogFileReader *this;
  iterator iVar8;
  ostream *poVar9;
  pointer pbVar10;
  const_iterator cVar11;
  char *pcVar12;
  GenericParseFunc p_Var13;
  Error *pEVar14;
  int ndx;
  int iVar15;
  pointer pbVar16;
  pointer pOVar17;
  long lVar18;
  DispatchParseFunc *pp_Var19;
  long lVar20;
  pointer pSVar21;
  long lVar22;
  int iVar23;
  pointer __k;
  Parser parser;
  allocator<char> local_171;
  ulong local_170;
  pointer local_168;
  CommandLine cmdLine;
  undefined1 local_138 [32];
  _Base_ptr local_118;
  size_t local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  ulong local_f0;
  vector<ShortBatchResult,_std::allocator<ShortBatchResult>_> results;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  caseList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  batchNames;
  
  cmdLine.outMode = OUTPUTMODE_ALL;
  cmdLine.outFormat = OUTPUTFORMAT_CSV;
  cmdLine.outValue = OUTPUTVALUE_STATUS_CODE;
  cmdLine.filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLine.filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  de::cmdline::detail::Parser::Parser(&parser);
  de::cmdline::detail::CommandLine::CommandLine((CommandLine *)local_138);
  if (argc < 1) {
    pEVar14 = (Error *)__cxa_allocate_exception(0x10);
    xe::Error::Error(pEVar14,(char *)0x0,"argc >= 1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/tools/xeTestLogCompare.cpp"
                     ,0x174);
    __cxa_throw(pEVar14,&xe::Error::typeinfo,std::runtime_error::~runtime_error);
  }
  caseList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1250ca;
  caseList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x125c68;
  caseList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_a011;
  de::cmdline::detail::Parser::addOption<opt::OutFormat>
            (&parser,(Option<opt::OutFormat> *)&caseList);
  results.super__Vector_base<ShortBatchResult,_std::allocator<ShortBatchResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x125bd8;
  results.super__Vector_base<ShortBatchResult,_std::allocator<ShortBatchResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1250f2;
  results.super__Vector_base<ShortBatchResult,_std::allocator<ShortBatchResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_a03e;
  de::cmdline::detail::Parser::addOption<opt::OutMode>(&parser,(Option<opt::OutMode> *)&results);
  batchNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1250d3;
  batchNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x126055;
  batchNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_a077;
  de::cmdline::detail::Parser::addOption<opt::OutValue>
            (&parser,(Option<opt::OutValue> *)&batchNames);
  bVar4 = de::cmdline::detail::Parser::parse
                    (&parser,argc + -1,argv + 1,(CommandLine *)local_138,(ostream *)&std::cerr);
  if ((bVar4) &&
     (local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pVVar5 = de::cmdline::detail::TypedFieldMap::get<opt::OutFormat>((TypedFieldMap *)local_138);
    cmdLine.outFormat = *pVVar5;
    pVVar6 = de::cmdline::detail::TypedFieldMap::get<opt::OutMode>((TypedFieldMap *)local_138);
    cmdLine.outMode = *pVVar6;
    pVVar7 = de::cmdline::detail::TypedFieldMap::get<opt::OutValue>((TypedFieldMap *)local_138);
    cmdLine.outValue = *pVVar7;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&cmdLine.filenames,&local_108);
    de::cmdline::detail::CommandLine::~CommandLine((CommandLine *)local_138);
    de::cmdline::detail::Parser::~Parser(&parser);
    results.super__Vector_base<ShortBatchResult,_std::allocator<ShortBatchResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    results.super__Vector_base<ShortBatchResult,_std::allocator<ShortBatchResult>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    results.super__Vector_base<ShortBatchResult,_std::allocator<ShortBatchResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    batchNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    batchNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    batchNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (cmdLine.filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        cmdLine.filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pEVar14 = (Error *)__cxa_allocate_exception(0x10);
      xe::Error::Error(pEVar14,(char *)0x0,"!cmdLine.filenames.empty()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/tools/xeTestLogCompare.cpp"
                       ,0x10e);
      __cxa_throw(pEVar14,&xe::Error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>::resize
              (&results,(long)cmdLine.filenames.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)cmdLine.filenames.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5);
    parser.m_options.
    super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parser.m_options.
    super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parser.m_options.
    super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar20 = 0;
    lVar18 = 0;
    for (lVar22 = 0;
        pbVar10 = cmdLine.filenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        lVar22 < (int)((ulong)((long)cmdLine.filenames.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)cmdLine.filenames.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5);
        lVar22 = lVar22 + 1) {
      this = (LogFileReader *)operator_new(0x40);
      LogFileReader::LogFileReader
                (this,(ShortBatchResult *)
                      ((long)&((results.
                                super__Vector_base<ShortBatchResult,_std::allocator<ShortBatchResult>_>
                                ._M_impl.super__Vector_impl_data._M_start)->resultHeaders).
                              super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar20),
                 *(char **)((long)&(pbVar10->_M_dataplus)._M_p + lVar18));
      de::SharedPtr<LogFileReader>::SharedPtr((SharedPtr<LogFileReader> *)local_138,this);
      std::vector<de::SharedPtr<LogFileReader>,std::allocator<de::SharedPtr<LogFileReader>>>::
      emplace_back<de::SharedPtr<LogFileReader>>
                ((vector<de::SharedPtr<LogFileReader>,std::allocator<de::SharedPtr<LogFileReader>>>
                  *)&parser,(SharedPtr<LogFileReader> *)local_138);
      de::SharedPtr<LogFileReader>::~SharedPtr((SharedPtr<LogFileReader> *)local_138);
      de::Thread::start((Thread *)
                        parser.m_options.
                        super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].dispatchParse);
      lVar18 = lVar18 + 0x20;
      lVar20 = lVar20 + 0x48;
    }
    lVar18 = 0;
    for (lVar20 = 0;
        lVar20 < (int)((ulong)((long)cmdLine.filenames.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)cmdLine.filenames.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5);
        lVar20 = lVar20 + 1) {
      de::Thread::join(*(Thread **)
                        ((long)&(parser.m_options.
                                 super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->shortName + lVar18));
      de::FilePath::FilePath
                ((FilePath *)&caseList,
                 *(char **)((long)&((cmdLine.filenames.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar18 * 2));
      de::FilePath::getBaseName_abi_cxx11_((string *)local_138,(FilePath *)&caseList);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&batchNames,
                 (string *)local_138);
      std::__cxx11::string::~string((string *)local_138);
      std::__cxx11::string::~string((string *)&caseList);
      lVar18 = lVar18 + 0x10;
    }
    std::vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>::
    ~vector((vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_> *)
            &parser);
    caseList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var1 = (_Base_ptr)(local_138 + 8);
    local_138._8_4_ = _S_red;
    local_138._16_8_ = (_Base_ptr)0x0;
    local_110 = 0;
    caseList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    caseList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138._24_8_ = p_Var1;
    local_118 = p_Var1;
    for (pSVar21 = results.super__Vector_base<ShortBatchResult,_std::allocator<ShortBatchResult>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pSVar21 !=
        results.super__Vector_base<ShortBatchResult,_std::allocator<ShortBatchResult>_>._M_impl.
        super__Vector_impl_data._M_finish; pSVar21 = pSVar21 + 1) {
      for (__k = (pSVar21->resultHeaders).
                 super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          __k != (pSVar21->resultHeaders).
                 super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
        iVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_138,&__k->casePath);
        if (iVar8._M_node == p_Var1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&caseList,&__k->casePath);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_138,&__k->casePath);
        }
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
    pbVar3 = caseList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar10 = caseList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (cmdLine.outFormat == OUTPUTFORMAT_CSV) {
      std::operator<<((ostream *)&std::cout,"TestCasePath");
      for (pbVar16 = batchNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar16 !=
          batchNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar16 = pbVar16 + 1) {
        poVar9 = std::operator<<((ostream *)&std::cout,",");
        std::operator<<(poVar9,(string *)pbVar16);
      }
      std::operator<<((ostream *)&std::cout,"\n");
    }
    local_f0 = (ulong)((long)pbVar3 - (long)pbVar10) >> 5;
    local_170 = 0;
    pbVar10 = caseList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (pbVar10 !=
           caseList.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
      parser.m_options.
      super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parser.m_options.
      super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      parser.m_options.
      super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar12 = (pbVar10->_M_dataplus)._M_p;
      local_168 = pbVar10;
      std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::resize
                ((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_> *)
                 &parser,((long)results.
                                super__Vector_base<ShortBatchResult,_std::allocator<ShortBatchResult>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)results.
                               super__Vector_base<ShortBatchResult,_std::allocator<ShortBatchResult>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x48);
      lVar18 = 0;
      for (lVar20 = 0;
          pSVar21 = results.super__Vector_base<ShortBatchResult,_std::allocator<ShortBatchResult>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          pOVar17 = parser.m_options.
                    super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          lVar20 < (int)(((long)results.
                                super__Vector_base<ShortBatchResult,_std::allocator<ShortBatchResult>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)results.
                               super__Vector_base<ShortBatchResult,_std::allocator<ShortBatchResult>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x48);
          lVar20 = lVar20 + 1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)local_138,pcVar12,&local_171);
        cVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)(&(pSVar21->resultMap)._M_t._M_impl.field_0x0 + lVar18),
                        (key_type *)local_138);
        std::__cxx11::string::~string((string *)local_138);
        if ((_Base_ptr)
            ((long)&(pSVar21->resultMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
            lVar18) == cVar11._M_node) {
          std::__cxx11::string::assign
                    ((char *)((long)&(parser.m_options.
                                      super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->shortName + lVar18
                             ));
          *(undefined8 *)
           (&(parser.m_options.
              super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
              ._M_impl.super__Vector_impl_data._M_start)->isFlag + lVar18) = 0xe00000000;
        }
        else {
          xe::TestCaseResultHeader::operator=
                    ((TestCaseResultHeader *)
                     ((long)&(parser.m_options.
                              super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start)->shortName + lVar18),
                     (TestCaseResultHeader *)
                     ((long)(int)cVar11._M_node[2]._M_color * 0x48 +
                     *(long *)((long)&(pSVar21->resultHeaders).
                                      super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar18)));
        }
        lVar18 = lVar18 + 0x48;
      }
      do {
        pp_Var19 = &pOVar17->dispatchParse;
        if ((pointer)pp_Var19 ==
            parser.m_options.
            super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish) break;
        pOVar2 = pOVar17 + 1;
        pOVar17 = (pointer)pp_Var19;
      } while (*(int *)((long)&pOVar2->description + 4) ==
               *(int *)&(parser.m_options.
                         super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start)->field_0x24);
      bVar4 = (pointer)pp_Var19 ==
              parser.m_options.
              super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if ((!bVar4) || (cmdLine.outMode == OUTPUTMODE_ALL)) {
        if (cmdLine.outFormat == OUTPUTFORMAT_CSV) {
          std::operator<<((ostream *)&std::cout,(string *)local_168);
          for (pOVar17 = parser.m_options.
                         super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pOVar17 !=
              parser.m_options.
              super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish; pOVar17 = (pointer)&pOVar17->dispatchParse
              ) {
            poVar9 = std::operator<<((ostream *)&std::cout,",");
            if (cmdLine.outValue == OUTPUTVALUE_STATUS_CODE) {
              p_Var13 = (GenericParseFunc)getStatusCodeName(*(TestStatusCode *)&pOVar17->field_0x24)
              ;
            }
            else {
              p_Var13 = pOVar17->parse;
            }
            std::operator<<(poVar9,(char *)p_Var13);
          }
        }
        else {
          if (cmdLine.outFormat != OUTPUTFORMAT_TEXT) goto LAB_00116f1f;
          poVar9 = std::operator<<((ostream *)&std::cout,(string *)local_168);
          std::operator<<(poVar9,"\n");
          lVar22 = 0;
          lVar18 = 0x28;
          for (lVar20 = 0;
              lVar20 < (int)(((long)parser.m_options.
                                    super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)parser.m_options.
                                   super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x48);
              lVar20 = lVar20 + 1) {
            poVar9 = std::operator<<((ostream *)&std::cout,"  ");
            poVar9 = std::operator<<(poVar9,(string *)
                                            ((long)&((batchNames.
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar22));
            poVar9 = std::operator<<(poVar9,": ");
            pcVar12 = getStatusCodeName(*(TestStatusCode *)
                                         ((long)parser.m_options.
                                                super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                         lVar18 + -4));
            poVar9 = std::operator<<(poVar9,pcVar12);
            poVar9 = std::operator<<(poVar9," (");
            poVar9 = std::operator<<(poVar9,(string *)
                                            ((long)&(parser.m_options.
                                                                                                          
                                                  super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  shortName + lVar18));
            std::operator<<(poVar9,")\n");
            lVar18 = lVar18 + 0x48;
            lVar22 = lVar22 + 0x20;
          }
        }
        std::operator<<((ostream *)&std::cout,"\n");
      }
LAB_00116f1f:
      local_170 = (ulong)((int)local_170 + (uint)bVar4);
      std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::~vector
                ((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_> *)
                 &parser);
      pbVar10 = local_168 + 1;
    }
    iVar15 = (int)local_f0;
    iVar23 = (int)local_170;
    if (cmdLine.outFormat == OUTPUTFORMAT_TEXT) {
      poVar9 = std::operator<<((ostream *)&std::cout,"  ");
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar23);
      poVar9 = std::operator<<(poVar9," / ");
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar15);
      std::operator<<(poVar9," test case results match.\n");
      poVar9 = std::operator<<((ostream *)&std::cout,"  Comparison ");
      pcVar12 = "passed";
      if (iVar23 != iVar15) {
        pcVar12 = "FAILED";
      }
      poVar9 = std::operator<<(poVar9,pcVar12);
      std::operator<<(poVar9,"!\n");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&caseList);
    iVar15 = -(uint)(iVar23 != iVar15);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&batchNames);
    std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>::~vector(&results);
  }
  else {
    poVar9 = std::operator<<((ostream *)&std::cout,*argv);
    std::operator<<(poVar9,": [options] [filenames]\n");
    de::cmdline::detail::Parser::help(&parser,(ostream *)&std::cout);
    de::cmdline::detail::CommandLine::~CommandLine((CommandLine *)local_138);
    de::cmdline::detail::Parser::~Parser(&parser);
    iVar15 = -1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cmdLine.filenames);
  return iVar15;
}

Assistant:

int main (int argc, const char* const* argv)
{
	CommandLine cmdLine;

	if (!parseCommandLine(cmdLine, argc, argv))
		return -1;

	try
	{
		bool compareOk = runCompare(cmdLine, std::cout);
		return compareOk ? 0 : -1;
	}
	catch (const std::exception& e)
	{
		printf("FATAL ERROR: %s\n", e.what());
		return -1;
	}
}